

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colamd.c
# Opt level: O0

void print_report(char *method,int *stats)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int i3;
  int i2;
  int i1;
  int *stats_local;
  char *method_local;
  
  printf("\n%s version %d.%d, %s: ",method,2,9,"Oct 10, 2014");
  if (stats == (int *)0x0) {
    printf("No statistics available.\n");
  }
  else {
    uVar1 = stats[4];
    uVar2 = stats[5];
    uVar3 = stats[6];
    if (stats[3] < 0) {
      printf("ERROR.  ");
    }
    else {
      printf("OK.  ");
    }
    switch(stats[3]) {
    case 1:
      printf("Matrix has unsorted or duplicate row indices.\n");
      printf("%s: number of duplicate or out-of-order row indices: %d\n",method,(ulong)uVar3);
      printf("%s: last seen duplicate or out-of-order row index:   %d\n",method,(ulong)uVar2);
      printf("%s: last seen in column:                             %d",method,(ulong)uVar1);
    case 0:
      printf("\n");
      printf("%s: number of dense or empty rows ignored:           %d\n",method,(ulong)(uint)*stats)
      ;
      printf("%s: number of dense or empty columns ignored:        %d\n",method,
             (ulong)(uint)stats[1]);
      printf("%s: number of garbage collections performed:         %d\n",method,
             (ulong)(uint)stats[2]);
      break;
    case -10:
      printf("Out of memory.\n");
      break;
    case -9:
      printf("Row index (row %d) out of bounds (%d to %d) in column %d.\n",(ulong)uVar2,0,
             (ulong)(uVar3 - 1),(ulong)uVar1);
      break;
    case -8:
      printf("Column %d has a negative number of nonzero entries (%d).\n",(ulong)uVar1,(ulong)uVar2)
      ;
      break;
    case -7:
      printf("Array A too small.\n");
      printf("        Need Alen >= %d, but given only Alen = %d.\n",(ulong)uVar1,(ulong)uVar2);
      break;
    case -6:
      printf("Invalid column pointer, p [0] = %d, must be zero.\n",(ulong)uVar1);
      break;
    case -5:
      printf("Invalid number of nonzero entries (%d).\n",(ulong)uVar1);
      break;
    case -4:
      printf("Invalid number of columns (%d).\n",(ulong)uVar1);
      break;
    case -3:
      printf("Invalid number of rows (%d).\n",(ulong)uVar1);
      break;
    case -2:
      printf("Array p (column pointers for matrix) not present.\n");
      break;
    case -1:
      printf("Array A (row indices of matrix) not present.\n");
    }
  }
  return;
}

Assistant:

PRIVATE void print_report
(
    const char *method,
    Int stats [COLAMD_STATS]
)
{

    Int i1, i2, i3 ;

    SUITESPARSE_PRINTF ("\n%s version %d.%d, %s: ", method,
            COLAMD_MAIN_VERSION, COLAMD_SUB_VERSION, COLAMD_DATE) ;

    if (!stats)
    {
        SUITESPARSE_PRINTF ("No statistics available.\n") ;
	return ;
    }

    i1 = stats [COLAMD_INFO1] ;
    i2 = stats [COLAMD_INFO2] ;
    i3 = stats [COLAMD_INFO3] ;

    if (stats [COLAMD_STATUS] >= 0)
    {
        SUITESPARSE_PRINTF ("OK.  ") ;
    }
    else
    {
        SUITESPARSE_PRINTF ("ERROR.  ") ;
    }

    switch (stats [COLAMD_STATUS])
    {

	case COLAMD_OK_BUT_JUMBLED:

            SUITESPARSE_PRINTF(
                    "Matrix has unsorted or duplicate row indices.\n") ;

            SUITESPARSE_PRINTF(
                    "%s: number of duplicate or out-of-order row indices: %d\n",
                    method, i3) ;

            SUITESPARSE_PRINTF(
                    "%s: last seen duplicate or out-of-order row index:   %d\n",
                    method, INDEX (i2)) ;

            SUITESPARSE_PRINTF(
                    "%s: last seen in column:                             %d",
                    method, INDEX (i1)) ;

	    /* no break - fall through to next case instead */

	case COLAMD_OK:

            SUITESPARSE_PRINTF("\n") ;

            SUITESPARSE_PRINTF(
                    "%s: number of dense or empty rows ignored:           %d\n",
                    method, stats [COLAMD_DENSE_ROW]) ;

            SUITESPARSE_PRINTF(
                    "%s: number of dense or empty columns ignored:        %d\n",
                    method, stats [COLAMD_DENSE_COL]) ;

            SUITESPARSE_PRINTF(
                    "%s: number of garbage collections performed:         %d\n",
                    method, stats [COLAMD_DEFRAG_COUNT]) ;
	    break ;

	case COLAMD_ERROR_A_not_present:

	    SUITESPARSE_PRINTF(
                    "Array A (row indices of matrix) not present.\n") ;
	    break ;

	case COLAMD_ERROR_p_not_present:

            SUITESPARSE_PRINTF(
                    "Array p (column pointers for matrix) not present.\n") ;
	    break ;

	case COLAMD_ERROR_nrow_negative:

            SUITESPARSE_PRINTF("Invalid number of rows (%d).\n", i1) ;
	    break ;

	case COLAMD_ERROR_ncol_negative:

            SUITESPARSE_PRINTF("Invalid number of columns (%d).\n", i1) ;
	    break ;

	case COLAMD_ERROR_nnz_negative:

            SUITESPARSE_PRINTF(
                    "Invalid number of nonzero entries (%d).\n", i1) ;
	    break ;

	case COLAMD_ERROR_p0_nonzero:

            SUITESPARSE_PRINTF(
                    "Invalid column pointer, p [0] = %d, must be zero.\n", i1);
	    break ;

	case COLAMD_ERROR_A_too_small:

            SUITESPARSE_PRINTF("Array A too small.\n") ;
            SUITESPARSE_PRINTF(
                    "        Need Alen >= %d, but given only Alen = %d.\n",
                    i1, i2) ;
	    break ;

	case COLAMD_ERROR_col_length_negative:

            SUITESPARSE_PRINTF
            ("Column %d has a negative number of nonzero entries (%d).\n",
            INDEX (i1), i2) ;
	    break ;

	case COLAMD_ERROR_row_index_out_of_bounds:

            SUITESPARSE_PRINTF
            ("Row index (row %d) out of bounds (%d to %d) in column %d.\n",
            INDEX (i2), INDEX (0), INDEX (i3-1), INDEX (i1)) ;
	    break ;

	case COLAMD_ERROR_out_of_memory:

            SUITESPARSE_PRINTF("Out of memory.\n") ;
	    break ;

	/* v2.4: internal-error case deleted */
    }
}